

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

PVIPNode * PVIP_parse_string(pvip_t *pvip,char *string,int len,int debug,PVIPString **error)

{
  char c;
  int iVar1;
  PVIPString *pPVar2;
  size_t len_00;
  long lVar3;
  int local_e0;
  char ch_1;
  int i;
  char ch;
  GREG g;
  PVIPNode *root;
  PVIPString **error_local;
  int debug_local;
  int len_local;
  char *string_local;
  pvip_t *pvip_local;
  
  g.data.pvip = (pvip_t *)0x0;
  PVIP_init((GREG *)&i);
  g.valslen = 1;
  g.data.line_number_stack = (int *)0x0;
  g.data.line_number = 0;
  g.data._4_4_ = 0;
  g.data.root._0_4_ = 1;
  g.data._32_8_ = malloc(0x18);
  *(char **)g.data._32_8_ = string;
  *(long *)(g.data._32_8_ + 8) = (long)len;
  *(undefined8 *)(g.data._32_8_ + 0x10) = 0;
  g.data.fp = (FILE *)pvip;
  iVar1 = PVIP_parse((GREG *)&i);
  if (iVar1 == 0) {
    if (error != (PVIPString **)0x0) {
      pPVar2 = PVIP_string_new();
      *error = pPVar2;
      PVIP_string_concat(*error,"** Syntax error at line ",0x18);
      PVIP_string_concat_int(*error,(long)g.valslen);
      PVIP_string_concat(*error,"\n",1);
      if (*(char *)g._16_8_ != '\0') {
        PVIP_string_concat(*error,"** near ",8);
        pPVar2 = *error;
        len_00 = strlen((char *)g._16_8_);
        PVIP_string_concat(pPVar2,(char *)g._16_8_,len_00);
      }
      if ((g.buflen < g.offset) || (*(long *)(g.data._32_8_ + 8) == *(long *)(g.data._32_8_ + 0x10))
         ) {
        _i[g.offset] = '\0';
        PVIP_string_concat(*error," before text \"",0xe);
        while (((g.buflen < g.offset && (_i[g.buflen] != '\n')) && (_i[g.buflen] != '\r'))) {
          lVar3 = (long)g.buflen;
          g.buflen = g.buflen + 1;
          PVIP_string_concat_char(*error,_i[lVar3]);
        }
        if (g.buflen == g.offset) {
          while (*(long *)(g.data._32_8_ + 8) != *(long *)(g.data._32_8_ + 0x10)) {
            lVar3 = *(long *)(g.data._32_8_ + 0x10);
            *(long *)(g.data._32_8_ + 0x10) = lVar3 + 1;
            c = *(char *)(*(long *)g.data._32_8_ + lVar3);
            if (((c == '\0') || (c == '\n')) || (c == '\r')) break;
            PVIP_string_concat_char(*error,c);
          }
        }
        PVIP_string_concat_char(*error,'\"');
      }
      PVIP_string_concat(*error,"\n\n",2);
      free((void *)g.data._32_8_);
    }
  }
  else if (g.offset == g.buflen) {
    g.data.pvip = (pvip_t *)g.data.line_number_stack_size;
  }
  else if (error != (PVIPString **)0x0) {
    pPVar2 = PVIP_string_new();
    *error = pPVar2;
    PVIP_string_concat(*error,"Syntax error! Around:\n",0x16);
    for (local_e0 = 0; g.offset != g.buflen && local_e0 < 0x18; local_e0 = local_e0 + 1) {
      iVar1 = g.buflen + 1;
      lVar3 = (long)g.buflen;
      g.buflen = iVar1;
      if (*(char *)(*(long *)g.data._32_8_ + lVar3) != '\0') {
        PVIP_string_concat_char(*error,*(char *)(*(long *)g.data._32_8_ + lVar3));
      }
    }
    PVIP_string_concat_char(*error,'\n');
  }
  free((void *)g.data._0_8_);
  free((void *)g.data._32_8_);
  if (g.data.line_number_stack_size != 0) {
    PVIP_deinit((GREG *)&i);
    return (PVIPNode *)g.data.pvip;
  }
  __assert_fail("g.data.root",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/build_O0/gen.pvip.y.c"
                ,0x2c28,
                "PVIPNode *PVIP_parse_string(pvip_t *, const char *, int, int, PVIPString **)");
}

Assistant:

PVIPNode * PVIP_parse_string(pvip_t* pvip, const char *string, int len, int debug, PVIPString **error) {
    PVIPNode *root = NULL;

    GREG g;
    YY_NAME(init)(&g);

#ifdef YY_DEBUG
    g.debug=debug;
#endif

    g.data.line_number = 1;
    g.data.line_number_stack_size = 0;
    g.data.line_number_stack = NULL;
    g.data.is_string   = 1;
    g.data.str = malloc(sizeof(PVIPParserStringState));
    g.data.str->buf     = string;
    g.data.str->len     = len;
    g.data.str->pos     = 0;
    g.data.pvip = pvip;

    if (!YY_NAME(parse)(&g)) {
      if (error) {
        *error = PVIP_string_new();
        PVIP_string_concat(*error, "** Syntax error at line ", strlen("** Syntax error at line "));
        PVIP_string_concat_int(*error, g.data.line_number);
        PVIP_string_concat(*error, "\n", 1);
        if (g.text[0]) {
            PVIP_string_concat(*error, "** near ", strlen("** near "));
            PVIP_string_concat(*error, g.text, strlen(g.text));
        }
        if (g.pos < g.limit || g.data.str->len==g.data.str->pos) {
            g.buf[g.limit]= '\0';
            PVIP_string_concat(*error, " before text \"", strlen(" before text \""));
            while (g.pos < g.limit) {
                if ('\n' == g.buf[g.pos] || '\r' == g.buf[g.pos]) break;
                PVIP_string_concat_char(*error, g.buf[g.pos++]);
            }
            if (g.pos == g.limit) {
                while (g.data.str->len!=g.data.str->pos) {
                    char ch = g.data.str->buf[g.data.str->pos++];
                    if (!ch || '\n' == ch || '\r' == ch) {
                        break;
                    }
                    PVIP_string_concat_char(*error, ch);
                }
            }
            PVIP_string_concat_char(*error, '\"');
        }
        PVIP_string_concat(*error, "\n\n", 2);
        free(g.data.str);
      }
      goto finished;
    }
    if (g.limit!=g.pos) {
        if (error) {
            *error = PVIP_string_new();
            PVIP_string_concat(*error, "Syntax error! Around:\n", strlen("Syntax error! Around:\n"));
            int i;
            for (i=0; g.limit!=g.pos && i<24; i++) {
                char ch = g.data.str->buf[g.pos++];
                if (ch) {
                    PVIP_string_concat_char(*error, ch);
                }
            }
            PVIP_string_concat_char(*error, '\n');
        }
        goto finished;
    }
    root = g.data.root;

finished:

    free(g.data.line_number_stack);
    free(g.data.str);
    assert(g.data.root);
    YY_NAME(deinit)(&g);
    return root;
}